

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRN.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeLRN(ConvertLayerParameters layerParameters)

{
  Rep *pRVar1;
  string *psVar2;
  ConvolutionLayerParams *pCVar3;
  Type *pTVar4;
  Type *pTVar5;
  LRNLayerParams *this;
  long lVar6;
  void **ppvVar7;
  LRNParameter *pLVar8;
  long lVar9;
  long in_stack_00000008;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  int *in_stack_00000048;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_d8;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Type *local_40;
  RepeatedPtrFieldBase *local_38;
  
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     (in_stack_00000018,(Type *)0x0);
  if (((pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar4->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Must have 1 input and 1 output","");
    errorInCaffeProto(&local_d8,(pTVar4->name_).ptr_,(pTVar4->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_38 = in_stack_00000018;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = (pTVar4->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  lVar6 = (long)(pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_;
  local_40 = pTVar5;
  if (lVar6 != 0) {
    lVar9 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,*(value_type **)((long)ppvVar7 + lVar9));
      lVar9 = lVar9 + 8;
    } while (lVar6 * 8 != lVar9);
  }
  pRVar1 = (pTVar4->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  lVar6 = (long)(pTVar4->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar6 != 0) {
    lVar9 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((long)ppvVar7 + lVar9));
      lVar9 = lVar9 + 8;
    } while (lVar6 * 8 != lVar9);
  }
  convertCaffeMetadata
            ((pTVar4->name_).ptr_,&local_58,&local_78,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_38,
             in_stack_00000028);
  pTVar5 = local_40;
  pLVar8 = pTVar4->lrn_param_;
  if (pLVar8 == (LRNParameter *)0x0) {
    pLVar8 = (LRNParameter *)&caffe::_LRNParameter_default_instance_;
  }
  if (pLVar8->norm_region_ == 1) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"norm_region","");
    psVar2 = (pTVar4->name_).ptr_;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"LRN","");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"WITHIN CHANNEL","");
    unsupportedCaffeParrameterWithOption(&local_d8,psVar2,&local_b8,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (pLVar8->k_ <= 0.0) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"k","");
    psVar2 = (pTVar4->name_).ptr_;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"LRN","");
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_98,vsnprintf,0x3a,"%f",SUB84((double)pLVar8->k_,0));
    unsupportedCaffeParrameterWithOption(&local_d8,psVar2,&local_b8,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (pTVar5->_oneof_case_[0] != 0xb4) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar5);
    pTVar5->_oneof_case_[0] = 0xb4;
    this = (LRNLayerParams *)operator_new(0x28);
    CoreML::Specification::LRNLayerParams::LRNLayerParams(this);
    (pTVar5->layer_).lrn_ = this;
  }
  pCVar3 = (pTVar5->layer_).convolution_;
  (pCVar3->kernelsize_).current_size_ = (int)pLVar8->alpha_;
  (pCVar3->kernelsize_).total_size_ = (int)pLVar8->beta_;
  (pCVar3->kernelsize_).rep_ = (Rep *)(ulong)pLVar8->local_size_;
  pCVar3->_kernelsize_cached_byte_size_ = (int)pLVar8->k_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeLRN(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::LRNParameter& caffeLayerParams = caffeLayer.lrn_param();
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.norm_region()==caffe::LRNParameter::WITHIN_CHANNEL){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("norm_region",caffeLayer.name(),"LRN","WITHIN CHANNEL");
    }
    if (caffeLayerParams.k() <= 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("k",caffeLayer.name(),"LRN",std::to_string(caffeLayerParams.k()));
    }
    //***************************************************************
    
    Specification::LRNLayerParams* specLayerParams = specLayer->mutable_lrn();
    specLayerParams->set_alpha(caffeLayerParams.alpha());
    specLayerParams->set_beta(caffeLayerParams.beta());
    specLayerParams->set_localsize(caffeLayerParams.local_size());
    specLayerParams->set_k(caffeLayerParams.k());
    
}